

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

void __thiscall rw::Geometry::addMorphTargets(Geometry *this,int32 n)

{
  int iVar1;
  MorphTarget *pMVar2;
  V3d **ppVVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  MorphTarget *pMVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  if (n != 0) {
    if ((this->flags >> 0x18 & 1) == 0) {
      uVar4 = this->numVertices * 0xc;
      iVar10 = uVar4 + ((int)(this->flags << 0x1b) >> 0x1f & uVar4) + 0x28;
    }
    else {
      iVar10 = 0x28;
    }
    iVar5 = n + this->numMorphTargets;
    if (this->numMorphTargets == 0) {
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 323"
      ;
      pMVar2 = (MorphTarget *)(*DAT_00145dd8)((long)(iVar10 * iVar5),0x3000f);
      this->morphTargets = pMVar2;
    }
    else {
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 314"
      ;
      pMVar2 = (MorphTarget *)(*DAT_00145de0)(this->morphTargets,(long)(iVar10 * iVar5),0x3000f);
      this->morphTargets = pMVar2;
      iVar1 = this->numMorphTargets;
      for (lVar6 = 0; -((iVar10 + -0x28) * iVar1) != (int)lVar6; lVar6 = lVar6 + -1) {
        *(undefined1 *)((long)pMVar2 + lVar6 + (long)(iVar10 * iVar5) + -1) =
             *(undefined1 *)((long)pMVar2 + lVar6 + (long)(iVar1 * iVar10) + -1);
      }
    }
    iVar10 = this->numMorphTargets;
    uVar4 = this->flags;
    iVar1 = this->numVertices;
    iVar8 = 0;
    iVar9 = 0;
    if (0 < iVar5) {
      iVar9 = iVar5;
    }
    ppVVar3 = &pMVar2->normals;
    lVar6 = (long)iVar1 * 0xc;
    pMVar2 = pMVar2 + iVar5;
    for (; iVar9 != iVar8; iVar8 = iVar8 + 1) {
      ((MorphTarget *)(ppVVar3 + -4))->parent = this;
      ppVVar3[-1] = (V3d *)0x0;
      *ppVVar3 = (V3d *)0x0;
      if (iVar10 <= iVar8) {
        (((Sphere *)(ppVVar3 + -3))->center).x = 0.0;
        (((Sphere *)(ppVVar3 + -3))->center).y = 0.0;
        ppVVar3[-2] = (V3d *)0x0;
      }
      pMVar7 = pMVar2;
      if (iVar1 != 0 && (uVar4 & 0x1000000) == 0) {
        pMVar7 = (MorphTarget *)((long)&pMVar2->parent + lVar6);
        ppVVar3[-1] = (V3d *)pMVar2;
        if ((uVar4 & 0x10) != 0) {
          *ppVVar3 = (V3d *)pMVar7;
          pMVar7 = (MorphTarget *)((long)&pMVar7->parent + lVar6);
        }
      }
      ppVVar3 = ppVVar3 + 5;
      pMVar2 = pMVar7;
    }
    this->numMorphTargets = iVar5;
  }
  return;
}

Assistant:

void
Geometry::addMorphTargets(int32 n)
{
	if(n == 0)
		return;
	n += this->numMorphTargets;

	int32 sz;
	sz = sizeof(MorphTarget);
	if(!(this->flags & NATIVE)){
		sz += this->numVertices*sizeof(V3d);
		if(this->flags & NORMALS)
			sz += this->numVertices*sizeof(V3d);
	}

	// Memory layout: MorphTarget[n]; (vertices and normals)[n]
	MorphTarget *mts;
	if(this->numMorphTargets){
		mts = (MorphTarget*)rwResize(this->morphTargets, n*sz, MEMDUR_EVENT | ID_GEOMETRY);
		this->morphTargets = mts;
		// Since we now have more morph targets than before, move the vertex data up
		uint8 *src = (uint8*)mts + sz*this->numMorphTargets;
		uint8 *dst = (uint8*)mts + sz*n;
		uint32 len = (sz-sizeof(MorphTarget))*this->numMorphTargets;
		while(len--)
			*--dst = *--src;
	}else{
		mts = (MorphTarget*)rwNew(n*sz, MEMDUR_EVENT | ID_GEOMETRY);
		this->morphTargets = mts;
	}

	// Set up everything and initialize the bounding sphere for new morph targets
	V3d *data  = (V3d*)&mts[n];
	for(int32 i = 0; i < n; i++){
		mts->parent = this;
		mts->vertices = nil;
		mts->normals = nil;
		if(i >= this->numMorphTargets){
			mts->boundingSphere.center.x = 0.0f;
			mts->boundingSphere.center.y = 0.0f;
			mts->boundingSphere.center.z = 0.0f;
			mts->boundingSphere.radius = 0.0f;
		}
		if(!(this->flags & NATIVE) && this->numVertices){
			mts->vertices = data;
			data += this->numVertices;
			if(this->flags & NORMALS){
				mts->normals = data;
				data += this->numVertices;
			}
		}
		mts++;
	}
	this->numMorphTargets = n;
}